

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O3

void __thiscall
GraphTestCycleInEdgesButNotInNodes3::~GraphTestCycleInEdgesButNotInNodes3
          (GraphTestCycleInEdgesButNotInNodes3 *this)

{
  GraphTest::~GraphTest(&this->super_GraphTest);
  operator_delete(this,0x230);
  return;
}

Assistant:

TEST_F(GraphTest, CycleInEdgesButNotInNodes3) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a b: cat c\n"
"build c: cat a\n"));
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("b"), NULL, &err));
  ASSERT_EQ("dependency cycle: a -> c -> a", err);
}